

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::MultiVertexArrayTest::Spec::getDesc_abi_cxx11_(string *__return_storage_ptr__,Spec *this)

{
  ArraySpec *pAVar1;
  ArraySpec *pAVar2;
  ostream *poVar3;
  Storage storage;
  InputType type;
  OutputType type_00;
  char *pcVar4;
  string local_220;
  string local_200;
  string local_1e0;
  const_reference local_1b0;
  ArraySpec *array;
  size_t ndx;
  stringstream desc;
  ostream local_190 [376];
  Spec *local_18;
  Spec *this_local;
  
  local_18 = this;
  this_local = (Spec *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&ndx);
  for (array = (ArraySpec *)0x0; pAVar1 = array,
      pAVar2 = (ArraySpec *)
               std::
               vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ::size(&this->arrays), pAVar1 < pAVar2;
      array = (ArraySpec *)((long)&array->inputType + 1)) {
    local_1b0 = std::
                vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                ::operator[](&this->arrays,(size_type)array);
    poVar3 = std::operator<<(local_190,"Array ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)array);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,"Storage in ");
    gls::Array::storageToString_abi_cxx11_(&local_1e0,(Array *)(ulong)local_1b0->storage,storage);
    poVar3 = std::operator<<(poVar3,(string *)&local_1e0);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"stride ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0->stride);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"input datatype ");
    gls::Array::inputTypeToString_abi_cxx11_(&local_200,(Array *)(ulong)local_1b0->inputType,type);
    poVar3 = std::operator<<(poVar3,(string *)&local_200);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"input component count ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0->componentCount);
    poVar3 = std::operator<<(poVar3,", ");
    pcVar4 = "";
    if ((local_1b0->normalize & 1U) != 0) {
      pcVar4 = "normalized, ";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"used as ");
    gls::Array::outputTypeToString_abi_cxx11_
              (&local_220,(Array *)(ulong)local_1b0->outputType,type_00);
    poVar3 = std::operator<<(poVar3,(string *)&local_220);
    std::operator<<(poVar3,", ");
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  poVar3 = std::operator<<(local_190,"drawArrays(), ");
  poVar3 = std::operator<<(poVar3,"first ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->first);
  poVar3 = std::operator<<(poVar3,", ");
  std::ostream::operator<<(poVar3,this->drawCount);
  if (this->primitive == PRIMITIVE_POINTS) {
    std::operator<<(local_190,"points");
  }
  else if (this->primitive == PRIMITIVE_TRIANGLES) {
    std::operator<<(local_190,"quads ");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ndx);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiVertexArrayTest::Spec::getDesc (void) const
{
	std::stringstream desc;

	for (size_t ndx = 0; ndx < arrays.size(); ++ndx)
	{
		const ArraySpec& array = arrays[ndx];

		desc
			<< "Array " << ndx << ": "
			<< "Storage in " << Array::storageToString(array.storage) << ", "
			<< "stride " << array.stride << ", "
			<< "input datatype " << Array::inputTypeToString((Array::InputType)array.inputType) << ", "
			<< "input component count " << array.componentCount << ", "
			<< (array.normalize ? "normalized, " : "")
			<< "used as " << Array::outputTypeToString(array.outputType) << ", ";
	}

	desc
		<< "drawArrays(), "
		<< "first " << first << ", "
		<< drawCount;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			desc << "quads ";
			break;
		case Array::PRIMITIVE_POINTS:
			desc << "points";
			break;

		default:
			DE_ASSERT(false);
			break;
	}


	return desc.str();
}